

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

bool ExecuteWitnessScript
               (Span<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *stack_span,
               CScript *exec_script,uint flags,SigVersion sigversion,BaseSignatureChecker *checker,
               ScriptExecutionData *execdata,ScriptError *serror)

{
  pointer puVar1;
  pointer puVar2;
  bool bVar3;
  pointer pvVar4;
  uint uVar5;
  pointer pvVar6;
  undefined4 in_register_00000014;
  CScript *script;
  ulong uVar7;
  uint uVar8;
  const_iterator end;
  CScript *pCVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  const_iterator pc;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  stack;
  opcodetype local_5c;
  const_iterator local_58;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_50;
  long local_38;
  
  script = (CScript *)CONCAT44(in_register_00000014,flags);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
  ::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>const*,void>
            ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              *)&local_50,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)stack_span,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             ((long)stack_span + (long)exec_script * 0x18),(allocator_type *)&local_58);
  pvVar4 = local_50.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar6 = local_50.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((SigVersion)checker == TAPSCRIPT) {
    uVar8 = (script->super_CScriptBase)._size;
    uVar5 = uVar8 - 0x1d;
    local_58.ptr = (uchar *)(script->super_CScriptBase)._union.indirect_contents.indirect;
    if (uVar8 < 0x1d) {
      uVar5 = uVar8;
      local_58.ptr = (uchar *)script;
    }
    if (0 < (int)uVar5) {
      end.ptr = (uchar *)((long)&(((CScript *)local_58.ptr)->super_CScriptBase)._union +
                         (ulong)uVar5);
      do {
        bVar3 = GetScriptOp(&local_58,end,&local_5c,
                            (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0);
        if (!bVar3) {
          uVar8 = 0xf;
          bVar3 = false;
          if (pc.ptr != (uchar *)0x0) {
LAB_00788b01:
            *(uint *)pc.ptr = uVar8;
          }
          goto LAB_00788b27;
        }
        bVar3 = IsOpSuccess(&local_5c);
        if (bVar3) {
          bVar3 = (sigversion >> 0x13 & 1) == 0;
          if (pc.ptr != (uchar *)0x0) {
            uVar8 = (int)(sigversion << 0xc) >> 0x1f & 0x23;
            goto LAB_00788b01;
          }
          goto LAB_00788b27;
        }
        uVar8 = (script->super_CScriptBase)._size;
        uVar5 = uVar8 - 0x1d;
        if (uVar8 < 0x1d) {
          uVar5 = uVar8;
        }
        pCVar9 = (CScript *)(script->super_CScriptBase)._union.indirect_contents.indirect;
        if (uVar8 < 0x1d) {
          pCVar9 = script;
        }
        end.ptr = (uchar *)((long)&(pCVar9->super_CScriptBase)._union + (long)(int)uVar5);
      } while (local_58.ptr < end.ptr);
    }
    pvVar4 = local_50.
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar6 = local_50.
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (1000 < (ulong)(((long)local_50.
                              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_50.
                              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)
       ) {
      if (pc.ptr != (uchar *)0x0) {
        pc.ptr[0] = '\a';
        pc.ptr[1] = '\0';
        pc.ptr[2] = '\0';
        pc.ptr[3] = '\0';
      }
      goto LAB_00788b25;
    }
  }
  for (; pvVar4 != pvVar6; pvVar4 = pvVar4 + 1) {
    if (0x208 < (ulong)((long)(pvVar4->
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(pvVar4->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_start)) {
      if (pc.ptr != (uchar *)0x0) {
        pc.ptr[0] = '\x05';
        pc.ptr[1] = '\0';
        pc.ptr[2] = '\0';
        pc.ptr[3] = '\0';
      }
      goto LAB_00788b25;
    }
  }
  bVar3 = EvalScript(&local_50,script,sigversion,(BaseSignatureChecker *)execdata,
                     (SigVersion)checker,(ScriptExecutionData *)serror,(ScriptError *)pc.ptr);
  if (bVar3) {
    if ((long)local_50.
              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_50.
              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x18) {
      puVar1 = local_50.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar2 = local_50.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (puVar2 != puVar1) {
        uVar7 = 0;
        uVar10 = 1;
        do {
          if (puVar1[uVar7] != '\0') {
            bVar3 = true;
            goto LAB_00788b27;
          }
          bVar3 = uVar10 < (ulong)((long)puVar2 - (long)puVar1);
          uVar7 = uVar10;
          uVar10 = (ulong)((int)uVar10 + 1);
        } while (bVar3);
      }
      if (pc.ptr != (uchar *)0x0) {
        pc.ptr[0] = '\x02';
        pc.ptr[1] = '\0';
        pc.ptr[2] = '\0';
        pc.ptr[3] = '\0';
      }
    }
    else if (pc.ptr != (uchar *)0x0) {
      pc.ptr[0] = '\x1d';
      pc.ptr[1] = '\0';
      pc.ptr[2] = '\0';
      pc.ptr[3] = '\0';
    }
  }
LAB_00788b25:
  bVar3 = false;
LAB_00788b27:
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

static bool ExecuteWitnessScript(const Span<const valtype>& stack_span, const CScript& exec_script, unsigned int flags, SigVersion sigversion, const BaseSignatureChecker& checker, ScriptExecutionData& execdata, ScriptError* serror)
{
    std::vector<valtype> stack{stack_span.begin(), stack_span.end()};

    if (sigversion == SigVersion::TAPSCRIPT) {
        // OP_SUCCESSx processing overrides everything, including stack element size limits
        CScript::const_iterator pc = exec_script.begin();
        while (pc < exec_script.end()) {
            opcodetype opcode;
            if (!exec_script.GetOp(pc, opcode)) {
                // Note how this condition would not be reached if an unknown OP_SUCCESSx was found
                return set_error(serror, SCRIPT_ERR_BAD_OPCODE);
            }
            // New opcodes will be listed here. May use a different sigversion to modify existing opcodes.
            if (IsOpSuccess(opcode)) {
                if (flags & SCRIPT_VERIFY_DISCOURAGE_OP_SUCCESS) {
                    return set_error(serror, SCRIPT_ERR_DISCOURAGE_OP_SUCCESS);
                }
                return set_success(serror);
            }
        }

        // Tapscript enforces initial stack size limits (altstack is empty here)
        if (stack.size() > MAX_STACK_SIZE) return set_error(serror, SCRIPT_ERR_STACK_SIZE);
    }

    // Disallow stack item size > MAX_SCRIPT_ELEMENT_SIZE in witness stack
    for (const valtype& elem : stack) {
        if (elem.size() > MAX_SCRIPT_ELEMENT_SIZE) return set_error(serror, SCRIPT_ERR_PUSH_SIZE);
    }

    // Run the script interpreter.
    if (!EvalScript(stack, exec_script, flags, checker, sigversion, execdata, serror)) return false;

    // Scripts inside witness implicitly require cleanstack behaviour
    if (stack.size() != 1) return set_error(serror, SCRIPT_ERR_CLEANSTACK);
    if (!CastToBool(stack.back())) return set_error(serror, SCRIPT_ERR_EVAL_FALSE);
    return true;
}